

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_MockFailureTest_unexpectedCallHappened_TestShell::
~TEST_MockFailureTest_unexpectedCallHappened_TestShell
          (TEST_MockFailureTest_unexpectedCallHappened_TestShell *this)

{
  TEST_MockFailureTest_unexpectedCallHappened_TestShell *this_local;
  
  ~TEST_MockFailureTest_unexpectedCallHappened_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockFailureTest, unexpectedCallHappened)
{
    MockUnexpectedCallHappenedFailure failure(UtestShell::getCurrent(), "foobar", *list);
    STRCMP_EQUAL("Mock Failure: Unexpected call to function: foobar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled:\n"
                 "\t\t<none>\n"
                 "\tEXPECTED calls that WERE fulfilled:\n"
                 "\t\t<none>", failure.getMessage().asCharString());
}